

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

void __thiscall Date::add_month(Date *this,uint32_t n)

{
  Month MVar1;
  DaysInYear DVar2;
  uint uVar3;
  double dVar4;
  
  dVar4 = floor((double)n / 12.0);
  uVar3 = n % 0xc;
  if (0 < (int)dVar4) {
    this->days = this->days + (ulong)(uint)(int)dVar4 * 0x16d;
  }
  DVar2 = days_since_jan(this->days);
  days_in_months(DVar2.year);
  for (; uVar3 != 0; uVar3 = uVar3 - 1) {
    DVar2 = days_since_jan(this->days);
    MVar1 = month_of_day(DVar2);
    this->days = this->days + (long)*(int *)(&DAT_0011f6ec + (ulong)MVar1 * 4);
  }
  return;
}

Assistant:

void Date::add_month(uint32_t n)
{
	auto years_to_add = int(std::floor(n / 12.0));
	auto months_to_add = n % 12;
	if (years_to_add > 0)
		add_year(years_to_add);
	auto months = days_in_months(year());
	while (months_to_add > 0)
	{
		days += months[int(month()) - 1];
		--months_to_add;
	}
}